

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<false,true,false>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM2 [64];
  float derivative;
  int k;
  float sumSquared;
  float sum;
  double *outSumSquaredDerivatives_local;
  double *outSumDerivatives_local;
  double *outDerivatives_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  sum = 0.0;
  for (k = 0; k < *(int *)(this + 0x14); k = k + 1) {
    auVar1._0_8_ = (double)(*(float *)(*(long *)(this + 0xf8) + (long)k * 4) /
                           *(float *)(*(long *)(this + 0xf0) + (long)k * 4));
    auVar1._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(*(long *)(this + 0x78) + (long)k * 8);
    auVar3._0_8_ = (double)sum;
    auVar3._8_8_ = in_ZMM2._8_8_;
    in_ZMM2 = ZEXT1664(auVar3);
    auVar1 = vfmadd213sd_fma(auVar2,auVar1,auVar3);
    sum = (float)auVar1._0_8_;
  }
  *outSumDerivatives = (double)sum;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}